

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O0

bool __thiscall
QTest::TestMethods::invokeTest
          (TestMethods *this,int index,QLatin1StringView tag,optional<QTest::WatchDog> *watchDog)

{
  QLatin1StringView str;
  QLatin1StringView str_00;
  QAnyStringView s_00;
  QLatin1StringView tag_00;
  QLatin1StringView name_00;
  QLatin1StringView tag_01;
  QLatin1StringView global;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QTestTable *pQVar5;
  char *pcVar6;
  char *pcVar7;
  QString *pQVar8;
  char *in_RCX;
  char *in_RDX;
  long in_FS_OFFSET;
  QLatin1StringView QVar9;
  int dataCount;
  int curDataIndex;
  bool blacklisted;
  bool foundFunction;
  int curGlobalDataIndex;
  int globalDataCount;
  QTestTable *gTable;
  QByteArray *name;
  QTestDataSetter s;
  anon_class_1_0_00000001 dataTagMatches;
  QTestTable table;
  QBenchmarkTestMethodData benchmarkData;
  anon_class_16_2_1223fae0 dataTag;
  anon_class_16_2_3c5138a6 globalDataTag;
  char member [512];
  ArgBase *argBases [2];
  QStringBuilder<QLatin1String,_QLatin1String> *in_stack_fffffffffffffa98;
  QBenchmarkTestMethodData *in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffaac;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffab0;
  char *in_stack_fffffffffffffab8;
  anon_class_1_0_00000001 *in_stack_fffffffffffffac0;
  undefined1 *puVar10;
  QTestTable *in_stack_fffffffffffffac8;
  QTestData *in_stack_fffffffffffffad0;
  QTestData *in_stack_fffffffffffffad8;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  char *in_stack_fffffffffffffae8;
  char *in_stack_fffffffffffffaf0;
  char *in_stack_fffffffffffffaf8;
  undefined7 in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb07;
  char *in_stack_fffffffffffffb20;
  QTestData *in_stack_fffffffffffffb28;
  int local_498;
  int local_490;
  qsizetype local_428;
  char *pcStack_420;
  QString local_418 [2];
  char *local_3e8;
  char *pcStack_3e0;
  undefined4 local_3c0;
  undefined1 local_3b9;
  QStringBuilder<QLatin1String,_QLatin1String> *local_3b8;
  QBenchmarkTestMethodData *pQStack_3b0;
  char *data;
  char *in_stack_fffffffffffffc78;
  undefined1 *local_370;
  QLatin1StringView local_368;
  undefined1 local_2f8 [32];
  char *local_2d8;
  char *pcStack_2d0;
  undefined1 local_2a0 [24];
  qsizetype local_288;
  char *pcStack_280;
  ulong local_278;
  ArgBase **local_270;
  ulong local_268;
  ArgBase **ppAStack_260;
  ulong local_258;
  ArgBase **ppAStack_250;
  undefined1 **local_238;
  undefined8 local_230;
  QTestTable *local_228;
  undefined8 local_220;
  char local_218 [512];
  undefined1 *local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2f8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_2f8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_2f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_2f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_2d8 = in_RDX;
  pcStack_2d0 = in_RCX;
  QBenchmarkTestMethodData::QBenchmarkTestMethodData(in_stack_fffffffffffffaa0);
  QBenchmarkTestMethodData::current = (QBenchmarkTestMethodData *)local_2f8;
  std::vector<QMetaMethod,_std::allocator<QMetaMethod>_>::operator[]
            ((vector<QMetaMethod,_std::allocator<QMetaMethod>_> *)in_stack_fffffffffffffab0.m_data,
             CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  QMetaMethod::name();
  QLatin1String::QLatin1String
            ((QLatin1String *)in_stack_fffffffffffffab0.m_data,
             (QByteArray *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  local_368 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                         (size_t)in_stack_fffffffffffffaa0);
  ::operator+((QLatin1String *)in_stack_fffffffffffffaa0,&in_stack_fffffffffffffa98->a);
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffa98);
  QString::operator=((QString *)in_stack_fffffffffffffaa0,(QString *)in_stack_fffffffffffffa98);
  QString::~QString((QString *)0x14e4f9);
  memset(local_218,0xaa,0x200);
  local_370 = &DAT_aaaaaaaaaaaaaaaa;
  QTestTable::QTestTable((QTestTable *)in_stack_fffffffffffffab0.m_data);
  QByteArray::constData((QByteArray *)0x14e53e);
  QTestResult::setCurrentTestFunction((char *)0x14e546);
  pQVar5 = QTestTable::globalTestTable();
  iVar3 = QTestTable::dataCount((QTestTable *)0x14e574);
  local_490 = 0;
  local_220 = CONCAT44(0xaaaaaaaa,iVar3);
  bVar1 = false;
  local_228 = pQVar5;
  do {
    bVar2 = QTestTable::isEmpty((QTestTable *)0x14e5fc);
    if (!bVar2) {
      in_stack_fffffffffffffb28 =
           QTestTable::testData
                     ((QTestTable *)in_stack_fffffffffffffab0.m_data,in_stack_fffffffffffffaac);
      QTestResult::setCurrentGlobalTestData(in_stack_fffffffffffffb28);
    }
    if (local_490 == 0) {
      pcVar6 = QByteArray::constData((QByteArray *)0x14e6b3);
      in_stack_fffffffffffffb20 = local_218;
      snprintf(in_stack_fffffffffffffb20,0x200,"%s_data()",pcVar6);
      runWithWatchdog<QTest::TestMethods::invokeTest(int,QLatin1String,std::optional<QTest::WatchDog>&)const::__0>
                ((optional<QTest::WatchDog> *)in_stack_fffffffffffffaa0,
                 (anon_class_8_1_60e67bd8 *)in_stack_fffffffffffffa98);
      bVar2 = QTestResult::skipCurrentTest();
      if (bVar2) break;
    }
    local_498 = 0;
    iVar4 = QTestTable::dataCount((QTestTable *)0x14e73a);
    local_238 = &local_370;
    local_230 = CONCAT44(0xaaaaaaaa,iVar4);
    do {
      QTestResult::setSkipCurrentTest(false);
      QTestResult::setBlacklistCurrentTest(false);
      pcVar6 = local_2d8;
      data = pcStack_2d0;
      invokeTest::anon_class_16_2_1223fae0::operator()
                ((anon_class_16_2_1223fae0 *)in_stack_fffffffffffffab0.m_data,
                 in_stack_fffffffffffffaac);
      QLatin1String::QLatin1String
                ((QLatin1String *)in_stack_fffffffffffffab0.m_data,
                 (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      pcVar7 = invokeTest::anon_class_16_2_3c5138a6::operator()
                         (in_stack_fffffffffffffab0.m_data_utf8,in_stack_fffffffffffffaac);
      QLatin1String::QLatin1String
                ((QLatin1String *)in_stack_fffffffffffffab0.m_data,
                 (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      tag_01.m_size._7_1_ = in_stack_fffffffffffffb07;
      tag_01.m_size._0_7_ = in_stack_fffffffffffffb00;
      tag_01.m_data = pcVar7;
      QVar9.m_data = in_stack_fffffffffffffaf8;
      QVar9.m_size = (qsizetype)in_stack_fffffffffffffaf0;
      global.m_data = (char *)in_stack_fffffffffffffb28;
      global.m_size = (qsizetype)in_stack_fffffffffffffb20;
      in_stack_fffffffffffffa98 = local_3b8;
      in_stack_fffffffffffffaa0 = pQStack_3b0;
      in_stack_fffffffffffffb07 =
           invokeTest::anon_class_1_0_00000001::operator()
                     (in_stack_fffffffffffffac0,tag_01,QVar9,global);
      if ((bool)in_stack_fffffffffffffb07) {
        bVar1 = true;
        in_stack_fffffffffffffaf0 = QByteArray::constData((QByteArray *)0x14e86c);
        in_stack_fffffffffffffaf8 =
             invokeTest::anon_class_16_2_1223fae0::operator()
                       (in_stack_fffffffffffffab0.m_data_utf8,in_stack_fffffffffffffaac);
        in_stack_fffffffffffffae8 =
             invokeTest::anon_class_16_2_3c5138a6::operator()
                       (in_stack_fffffffffffffab0.m_data_utf8,in_stack_fffffffffffffaac);
        in_stack_fffffffffffffae7 =
             QTestPrivate::checkBlackLists(in_stack_fffffffffffffc78,data,pcVar6);
        if (((bool)in_stack_fffffffffffffae7) &&
           (QTestResult::setBlacklistCurrentTest(true), (skipBlacklisted & 1) != 0)) {
          qSkip((char *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98,0);
          QTestResult::finishedCurrentTestData();
          QTestResult::finishedCurrentTestDataCleanup();
        }
        else {
          local_3b9 = 0xaa;
          if (local_498 < iVar4) {
            in_stack_fffffffffffffad0 =
                 QTestTable::testData
                           ((QTestTable *)in_stack_fffffffffffffab0.m_data,in_stack_fffffffffffffaac
                           );
            in_stack_fffffffffffffad8 = in_stack_fffffffffffffad0;
          }
          else {
            in_stack_fffffffffffffad8 = (QTestData *)0x0;
          }
          QTestDataSetter::QTestDataSetter
                    ((QTestDataSetter *)in_stack_fffffffffffffaa0,
                     (QTestData *)in_stack_fffffffffffffa98);
          QFlags<Qt::MouseButton>::QFlags
                    ((QFlags<Qt::MouseButton> *)in_stack_fffffffffffffaa0,
                     (MouseButton)((ulong)in_stack_fffffffffffffa98 >> 0x20));
          QTestPrivate::qtestMouseButtons = local_3c0;
          lastMouseTimestamp = lastMouseTimestamp + 500;
          runWithWatchdog<QTest::TestMethods::invokeTest(int,QLatin1String,std::optional<QTest::WatchDog>&)const::__4>
                    ((optional<QTest::WatchDog> *)in_stack_fffffffffffffaa0,
                     (anon_class_16_2_f7f469bf *)in_stack_fffffffffffffa98);
          QTestDataSetter::~QTestDataSetter((QTestDataSetter *)0x14e9f1);
        }
        bVar2 = QLatin1String::isEmpty((QLatin1String *)0x14ea2a);
        if ((!bVar2) && (iVar3 == 0)) break;
      }
      local_498 = local_498 + 1;
    } while (local_498 < iVar4);
    QTestResult::setCurrentGlobalTestData((QTestData *)0x0);
    local_490 = local_490 + 1;
  } while (local_490 < iVar3);
  bVar2 = QLatin1String::isEmpty((QLatin1String *)0x14ea9e);
  if ((!bVar2) && (!bVar1)) {
    QLatin1String::QLatin1String
              ((QLatin1String *)in_stack_fffffffffffffab0.m_data,
               (QByteArray *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    local_3e8 = local_2d8;
    pcStack_3e0 = pcStack_2d0;
    name_00.m_size._7_1_ = in_stack_fffffffffffffae7;
    name_00.m_size._0_7_ = in_stack_fffffffffffffae0;
    name_00.m_data = in_stack_fffffffffffffae8;
    tag_00.m_data = (char *)in_stack_fffffffffffffad8;
    tag_00.m_size = (qsizetype)in_stack_fffffffffffffad0;
    printUnknownDataTagError
              (name_00,tag_00,in_stack_fffffffffffffac8,(QTestTable *)in_stack_fffffffffffffac0);
    QVar9 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                       (size_t)in_stack_fffffffffffffaa0);
    pQVar8 = local_418;
    local_428 = QVar9.m_size;
    local_288 = local_428;
    pcStack_420 = QVar9.m_data;
    pcStack_280 = pcStack_420;
    str.m_data = in_stack_fffffffffffffab8;
    str.m_size = (qsizetype)in_stack_fffffffffffffab0.m_data;
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),str);
    str_00.m_data = in_stack_fffffffffffffab8;
    str_00.m_size = (qsizetype)in_stack_fffffffffffffab0.m_data;
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               str_00);
    puVar10 = local_2a0;
    s_00.m_size = (size_t)in_stack_fffffffffffffab8;
    s_00.field_0.m_data = in_stack_fffffffffffffab0.m_data;
    QtPrivate::qStringLikeToArg(s_00);
    local_258 = local_278;
    ppAStack_250 = local_270;
    uStack_10 = 0;
    local_268 = local_278;
    ppAStack_260 = local_270;
    local_18 = puVar10;
    QtPrivate::argToQString((QAnyStringView *)pQVar8,local_278,local_270);
    pQVar8 = QtPrivate::asString(local_418);
    QString::toLocal8Bit(pQVar8);
    QByteArray::constData((QByteArray *)0x14ecba);
    QTestResult::addFailure
              (in_stack_fffffffffffffab0.m_data_utf8,
               (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
    QByteArray::~QByteArray((QByteArray *)0x14ecd5);
    QString::~QString((QString *)0x14ece2);
  }
  QTestResult::finishedCurrentTestFunction();
  QTestResult::setSkipCurrentTest(false);
  QTestResult::setBlacklistCurrentTest(false);
  QTestTable::~QTestTable((QTestTable *)in_stack_fffffffffffffaa0);
  QByteArray::~QByteArray((QByteArray *)0x14ed65);
  QBenchmarkTestMethodData::~QBenchmarkTestMethodData((QBenchmarkTestMethodData *)0x14ed72);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool TestMethods::invokeTest(int index, QLatin1StringView tag, std::optional<WatchDog> &watchDog) const
{
    QBenchmarkTestMethodData benchmarkData;
    QBenchmarkTestMethodData::current = &benchmarkData;

    const QByteArray &name = m_methods[index].name();
    QBenchmarkGlobalData::current->context.slotName = QLatin1StringView(name) + "()"_L1;

    char member[512];
    QTestTable table;

    QTestResult::setCurrentTestFunction(name.constData());

    const QTestTable *gTable = QTestTable::globalTestTable();
    const int globalDataCount = gTable->dataCount();
    int curGlobalDataIndex = 0;
    const auto globalDataTag = [gTable, globalDataCount](int index) {
        return globalDataCount ? gTable->testData(index)->dataTag() : nullptr;
    };

    const auto dataTagMatches = [](QLatin1StringView tag, QLatin1StringView local,
                                   QLatin1StringView global) {
        if (tag.isEmpty()) // No tag specified => run all data sets for this function
            return true;
        if (tag == local || tag == global) // Equal to either => run it
            return true;
        // Also allow global:local as a match:
        return tag.startsWith(global) && tag.endsWith(local) &&
               tag.size() == global.size() + 1 + local.size() &&
               tag[global.size()] == ':';
    };
    bool foundFunction = false;
    bool blacklisted = false;

    /* For each entry in the global data table, do: */
    do {
        if (!gTable->isEmpty())
            QTestResult::setCurrentGlobalTestData(gTable->testData(curGlobalDataIndex));

        if (curGlobalDataIndex == 0) {
            std::snprintf(member, 512, "%s_data()", name.constData());
            runWithWatchdog(watchDog, [&member] {
                invokeTestMethodIfExists(member);
            });
            if (QTestResult::skipCurrentTest())
                break;
        }

        int curDataIndex = 0;
        const int dataCount = table.dataCount();
        const auto dataTag = [&table, dataCount](int index) {
            return dataCount ? table.testData(index)->dataTag() : nullptr;
        };

        /* For each entry in this test's data table, do: */
        do {
            QTestResult::setSkipCurrentTest(false);
            QTestResult::setBlacklistCurrentTest(false);
            if (dataTagMatches(tag, QLatin1StringView(dataTag(curDataIndex)),
                               QLatin1StringView(globalDataTag(curGlobalDataIndex)))) {
                foundFunction = true;
                blacklisted = QTestPrivate::checkBlackLists(name.constData(), dataTag(curDataIndex),
                                                            globalDataTag(curGlobalDataIndex));
                if (blacklisted)
                    QTestResult::setBlacklistCurrentTest(true);

                if (blacklisted && skipBlacklisted) {
                    QTest::qSkip("Skipping blacklisted test since -skipblacklisted option is set.",
                                  NULL, 0);
                    QTestResult::finishedCurrentTestData();
                    QTestResult::finishedCurrentTestDataCleanup();
                } else {
                    QTestDataSetter s(
                        curDataIndex >= dataCount ? nullptr : table.testData(curDataIndex));

                    QTestPrivate::qtestMouseButtons = Qt::NoButton;

                    // Maintain at least 500ms mouse event timestamps between each test function
                    // call
                    QTest::lastMouseTimestamp += 500;

                    runWithWatchdog(watchDog, [this, index] {
                        invokeTestOnData(index);
                    });
                }

                if (!tag.isEmpty() && !globalDataCount)
                    break;
            }
            ++curDataIndex;
        } while (curDataIndex < dataCount);

        QTestResult::setCurrentGlobalTestData(nullptr);
        ++curGlobalDataIndex;
    } while (curGlobalDataIndex < globalDataCount);

    if (!tag.isEmpty() && !foundFunction) {
        printUnknownDataTagError(QLatin1StringView(name), tag, table, *gTable);
        QTestResult::addFailure(qPrintable("Data tag not found: %1"_L1.arg(tag)));
    }
    QTestResult::finishedCurrentTestFunction();
    QTestResult::setSkipCurrentTest(false);
    QTestResult::setBlacklistCurrentTest(false);

    return true;
}